

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DTDValidator::validateAttrValue
          (DTDValidator *this,XMLAttDef *attDef,XMLCh *attrValue,bool preValidation,
          XMLElementDecl *param_4)

{
  short *psVar1;
  bool bVar2;
  XMLCh XVar3;
  AttTypes AVar4;
  DefAttTypes DVar5;
  MemoryManager *pMVar6;
  MemoryManager *pMVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  XMLCh *pXVar10;
  undefined4 extraout_var_00;
  XMLCh *pXVar11;
  long lVar12;
  ulong uVar13;
  DTDEntityDecl *pDVar14;
  XMLRefInfo *valueToAdopt;
  XMLCh *pXVar15;
  undefined4 extraout_var_03;
  XMLScanner *pXVar16;
  long *plVar17;
  size_t sVar18;
  XMLCh XVar19;
  Codes toEmit;
  byte bVar20;
  ArrayJanitor<char16_t> janTmpVal;
  XMLCh tempBuffer [100];
  ArrayJanitor<char16_t> local_120;
  MemoryManager *local_110;
  _func_int **local_108;
  XMLCh *local_100;
  XMLCh local_f8 [100];
  XMLCh *text1;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  AVar4 = attDef->fType;
  DVar5 = attDef->fDefaultType;
  pXVar11 = attDef->fValue;
  iVar9 = (*(attDef->super_XSerializable)._vptr_XSerializable[5])(attDef);
  text1 = (XMLCh *)CONCAT44(extraout_var,iVar9);
  local_100 = attDef->fEnumeration;
  bVar2 = attDef->fExternalAttribute;
  if (pXVar11 == attrValue || (DVar5 != Fixed || preValidation)) goto LAB_003059e9;
  pXVar10 = pXVar11;
  pXVar15 = attrValue;
  if (pXVar11 == (XMLCh *)0x0 || attrValue == (XMLCh *)0x0) {
    if (attrValue == (XMLCh *)0x0) {
      if (pXVar11 == (XMLCh *)0x0) goto LAB_003059e9;
LAB_003059c8:
      XVar3 = *pXVar10;
    }
    else {
      XVar3 = *attrValue;
      if (XVar3 == L'\0' && pXVar11 != (XMLCh *)0x0) goto LAB_003059c8;
    }
    if (XVar3 == L'\0') goto LAB_003059e9;
  }
  else {
    do {
      XVar3 = *pXVar15;
      if (XVar3 == L'\0') goto LAB_003059c8;
      XVar19 = *pXVar10;
      pXVar10 = pXVar10 + 1;
      pXVar15 = pXVar15 + 1;
    } while (XVar3 == XVar19);
  }
  XMLValidator::emitError
            (&this->super_XMLValidator,NotSameAsFixedValue,text1,attrValue,pXVar11,(XMLCh *)0x0);
LAB_003059e9:
  if (AVar4 != AttTypes_Min) {
    if (*attrValue == L'\0') {
      XMLValidator::emitError
                (&this->super_XMLValidator,InvalidEmptyAttValue,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      return;
    }
    bVar20 = (byte)(0x3a8 >> ((byte)AVar4 & 0x1f)) & (uint)AVar4 < 10;
    uVar13 = 0;
    ArrayJanitor<char16_t>::ArrayJanitor(&local_120,(char16_t *)0x0);
    do {
      psVar1 = (short *)((long)attrValue + uVar13);
      uVar13 = uVar13 + 2;
    } while (*psVar1 != 0);
    if (uVar13 < 0xca) {
      pXVar11 = local_f8;
      XMLString::copyString(pXVar11,attrValue);
    }
    else {
      pMVar6 = ((this->super_XMLValidator).fScanner)->fMemoryManager;
      sVar18 = 0;
      do {
        psVar1 = (short *)((long)attrValue + sVar18);
        sVar18 = sVar18 + 2;
      } while (*psVar1 != 0);
      iVar9 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar18);
      memcpy((char16_t *)CONCAT44(extraout_var_00,iVar9),attrValue,sVar18);
      ArrayJanitor<char16_t>::reset
                (&local_120,(char16_t *)CONCAT44(extraout_var_00,iVar9),
                 ((this->super_XMLValidator).fScanner)->fMemoryManager);
      pXVar11 = ArrayJanitor<char16_t>::get(&local_120);
    }
    if ((bVar20 != 0) &&
       ((pXVar16 = (this->super_XMLValidator).fScanner, bVar2 == false ||
        (pXVar16->fStandalone == false)))) {
      XMLString::collapseWS(pXVar11,pXVar16->fMemoryManager);
    }
    bVar2 = ((this->super_XMLValidator).fScanner)->fDoNamespaces;
    local_108 = (_func_int **)&PTR__XMLRefInfo_00408410;
    do {
      if (((uint)AVar4 < 6) || (pXVar10 = pXVar11, AVar4 == Notation)) {
        if ((((this->super_XMLValidator).fReaderMgr)->fCurReader->fgCharCharsTable[(ushort)*pXVar11]
            & 2) == 0) {
          XMLValidator::emitError
                    (&this->super_XMLValidator,AttrValNotName,pXVar11,text1,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        pXVar10 = pXVar11 + 1;
      }
      while( true ) {
        XVar3 = *pXVar10;
        uVar13 = (ulong)(ushort)XVar3;
        if (XVar3 == L'\0') break;
        if (XVar3 == L' ') {
          if (bVar20 == 0) {
            XMLValidator::emitError
                      (&this->super_XMLValidator,NoMultipleValues,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
            goto LAB_00305e73;
          }
          break;
        }
        if (((XVar3 == L':') && (bVar2 != false)) &&
           (((uint)AVar4 < 6 || (uVar13 = 0x3a, AVar4 == Notation)))) {
          XMLValidator::emitError(&this->super_XMLValidator,ColonNotValidWithNS);
          uVar13 = (ulong)(ushort)*pXVar10;
        }
        if ((((this->super_XMLValidator).fReaderMgr)->fCurReader->fgCharCharsTable[uVar13] & 4) == 0
           ) {
          XMLValidator::emitError
                    (&this->super_XMLValidator,AttrValNotName,pXVar10,text1,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          goto LAB_00305e73;
        }
        pXVar10 = pXVar10 + 1;
      }
      *pXVar10 = L'\0';
      if ((uint)AVar4 < 4) {
        iVar9 = (*((this->super_XMLValidator).fScanner)->fValidationContext->_vptr_ValidationContext
                  [2])();
        lVar12 = CONCAT44(extraout_var_01,iVar9);
        if ((pXVar11 == (XMLCh *)0x0) || (uVar13 = (ulong)(ushort)*pXVar11, uVar13 == 0)) {
          uVar13 = 0;
        }
        else {
          XVar19 = pXVar11[1];
          if (XVar19 != L'\0') {
            pXVar15 = pXVar11 + 2;
            do {
              uVar13 = (ulong)(ushort)XVar19 + (uVar13 >> 0x18) + uVar13 * 0x26;
              XVar19 = *pXVar15;
              pXVar15 = pXVar15 + 1;
            } while (XVar19 != L'\0');
          }
          uVar13 = uVar13 % *(ulong *)(lVar12 + 0x18);
        }
        plVar17 = *(long **)(*(long *)(lVar12 + 0x10) + uVar13 * 8);
        if (plVar17 != (long *)0x0) {
          do {
            bVar8 = StringHasher::equals((StringHasher *)(lVar12 + 0x30),pXVar11,(void *)plVar17[2])
            ;
            if (bVar8) {
              valueToAdopt = (XMLRefInfo *)*plVar17;
              if (valueToAdopt != (XMLRefInfo *)0x0) {
                if ((AVar4 != ID) || (valueToAdopt->fDeclared == false)) goto LAB_00305e1a;
                XMLValidator::emitError
                          (&this->super_XMLValidator,ReusedIDValue,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0
                           ,(XMLCh *)0x0);
                goto LAB_00305e1f;
              }
              break;
            }
            plVar17 = (long *)plVar17[1];
          } while (plVar17 != (long *)0x0);
        }
        pMVar6 = ((this->super_XMLValidator).fScanner)->fMemoryManager;
        valueToAdopt = (XMLRefInfo *)XMemory::operator_new(0x20,pMVar6);
        pXVar16 = (this->super_XMLValidator).fScanner;
        pMVar7 = pXVar16->fMemoryManager;
        (valueToAdopt->super_XSerializable)._vptr_XSerializable = local_108;
        valueToAdopt->fDeclared = false;
        valueToAdopt->fUsed = false;
        valueToAdopt->fRefName = (XMLCh *)0x0;
        valueToAdopt->fMemoryManager = pMVar7;
        if (pXVar11 == (XMLCh *)0x0) {
          pXVar15 = (XMLCh *)0x0;
        }
        else {
          sVar18 = 0;
          do {
            psVar1 = (short *)((long)pXVar11 + sVar18);
            sVar18 = sVar18 + 2;
          } while (*psVar1 != 0);
          local_110 = pMVar6;
          iVar9 = (*pMVar7->_vptr_MemoryManager[3])(pMVar7,sVar18);
          pXVar15 = (XMLCh *)CONCAT44(extraout_var_02,iVar9);
          memcpy(pXVar15,pXVar11,sVar18);
          pXVar16 = (this->super_XMLValidator).fScanner;
        }
        valueToAdopt->fRefName = pXVar15;
        iVar9 = (*pXVar16->fValidationContext->_vptr_ValidationContext[2])();
        RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                  ((RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
                   CONCAT44(extraout_var_03,iVar9),valueToAdopt->fRefName,valueToAdopt);
LAB_00305e1a:
        if (AVar4 == ID) {
LAB_00305e1f:
          valueToAdopt->fDeclared = true;
        }
        else if (!preValidation) {
          valueToAdopt->fUsed = true;
        }
      }
      else if ((AVar4 & ~ID) == Entity && !preValidation) {
        pDVar14 = DTDGrammar::getEntityDecl(this->fDTDGrammar,pXVar11);
        if (pDVar14 == (DTDEntityDecl *)0x0) {
          toEmit = UnknownEntityRefAttr;
          pXVar15 = text1;
        }
        else {
          if ((pDVar14->super_XMLEntityDecl).fNotationName != (XMLCh *)0x0) goto LAB_00305e3f;
          toEmit = BadEntityRefAttr;
          pXVar15 = pXVar11;
          pXVar11 = text1;
        }
        XMLValidator::emitError
                  (&this->super_XMLValidator,toEmit,pXVar15,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else if (((AVar4 & ~ID) == Notation) &&
              (bVar8 = XMLString::isInList(pXVar11,local_100), !bVar8)) {
        XMLValidator::emitError
                  (&this->super_XMLValidator,DoesNotMatchEnumList,pXVar11,text1,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
LAB_00305e3f:
      pXVar11 = pXVar10 + 1;
    } while ((XVar3 != L'\0' & bVar20) != 0);
LAB_00305e73:
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_120);
  }
  return;
}

Assistant:

void
DTDValidator::validateAttrValue(const   XMLAttDef*      attDef
                                , const XMLCh* const    attrValue
                                , bool                  preValidation
                                , const XMLElementDecl*)
{
    //
    //  Get quick refs to lost of of the stuff in the passed objects in
    //  order to simplify the code below, which will reference them very
    //  often.
    //
    const XMLAttDef::AttTypes       type = attDef->getType();
    const XMLAttDef::DefAttTypes    defType = attDef->getDefaultType();
    const XMLCh* const              valueText = attDef->getValue();
    const XMLCh* const              fullName = attDef->getFullName();
    const XMLCh* const              enumList = attDef->getEnumeration();
    const bool                      isExternal = attDef->isExternal();

    //
    //  If the default type is fixed, then make sure the passed value maps
    //  to the fixed value.
    //  If during preContentValidation, the value we are validating is the fixed value itself
    //  so no need to compare.
    //  Only need to do this for regular attribute value validation
    //
    if (defType == XMLAttDef::Fixed && !preValidation)
    {
        if (!XMLString::equals(attrValue, valueText))
            emitError(XMLValid::NotSameAsFixedValue, fullName, attrValue, valueText);
    }

    //
    //  If its a CDATA attribute, then we are done with any DTD level
    //  validation else do the rest.
    //
    if (type == XMLAttDef::CData)
        return;



    // An empty string cannot be valid for any of the other types
    if (!attrValue[0])
    {
        emitError(XMLValid::InvalidEmptyAttValue, fullName);
        return;
    }

    // See whether we are doing multiple values or not
    const bool multipleValues =
    (
        (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::NmTokens)
        || (type == XMLAttDef::Notation)
        || (type == XMLAttDef::Enumeration)
    );

    // And whether we must check for a first name char
    const bool firstNameChar =
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entity)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::Notation)
    );

    // Whether it requires ref checking stuff
    const bool isARefType
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
    );

    // Some trigger flags to avoid issuing redundant errors and whatnot    
    bool alreadyCapped = false;

    //
    //  Make a copy of the text that we can mangle and get a pointer we can
    //  move through the value
    //

    // Use a stack-based buffer, when possible...
    XMLCh   tempBuffer[100];

    XMLCh* pszTmpVal = 0;

    ArrayJanitor<XMLCh> janTmpVal(0);

    if (XMLString::stringLen(attrValue) < sizeof(tempBuffer) / sizeof(tempBuffer[0]))
    {
        XMLString::copyString(tempBuffer, attrValue);
        pszTmpVal = tempBuffer;
    }
    else
    {
        janTmpVal.reset(XMLString::replicate(attrValue, getScanner()->getMemoryManager()), getScanner()->getMemoryManager());
        pszTmpVal = janTmpVal.get();
    }

    //  if the type is an enumeration, normalize it, unless standalone = yes is specified
    //  "The standalone document declaration MUST have the value "no" if any external markup declarations contain declarations of:
    //   - ...
    //   - attributes with tokenized types, where the attribute appears in the document with a value such that normalization will 
    //     produce a different value from that which would be produced in the absence of the declaration"
    if (multipleValues && (!isExternal || !getScanner()->getStandalone()))
        XMLString::collapseWS(pszTmpVal, getScanner()->getMemoryManager());

    XMLCh* valPtr = pszTmpVal;

    bool doNamespace = getScanner()->getDoNamespaces();

    while (true)
    {
        //
        //  Make sure the first character is a valid first name char, i.e.
        //  if its a Name value. For NmToken values we don't treat the first
        //  char any differently.
        //
        if (firstNameChar)
        {
            // If its not, emit and error but try to keep going
            if (!getReaderMgr()->getCurrentReader()->isFirstNameChar(*valPtr))
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
            valPtr++;
        }

        // Make sure all the remaining chars are valid name chars
        while (*valPtr)
        {
            //
            //  If we hit a whitespace, its either a break between two
            //  or more values, or an error if we have a single value.
            //
            //
            //   XML1.0-3rd
            //
            //   [6]   Names   ::=   Name (#x20 Name)*
            //   [8]   Nmtokens   ::=   Nmtoken (#x20 Nmtoken)*
            //
            //   only and only ONE #x20 is allowed to be the delimiter
            //
            if (*valPtr==chSpace)
            {
                if (!multipleValues)
                {
                    emitError(XMLValid::NoMultipleValues, fullName);
                    return;
                }

                break;
            }

            // Now this attribute can be of type
            //     ID, IDREF, IDREFS, ENTITY, ENTITIES, NOTATION, NMTOKEN, NMTOKENS, ENUMERATION
            //  All these must be valid XMLName
            // If namespace is enabled, colon is not allowed in the first 6

            if (doNamespace && *valPtr == chColon && firstNameChar)
                emitError(XMLValid::ColonNotValidWithNS);

            if (!getReaderMgr()->getCurrentReader()->isNameChar(*valPtr))
            {
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
                return;
            }
            valPtr++;
        }

        //
        //  Cap it off at the current non-name char. If already capped,
        //  then remember this.
        //
        if (!(*valPtr))
            alreadyCapped = true;
        *valPtr = 0;

        //
        //  If this type of attribute requires that we track reference
        //  stuff, then handle that.
        //
        if (isARefType)
        {
            if ((type == XMLAttDef::ID)
            ||  (type == XMLAttDef::IDRef)
            ||  (type == XMLAttDef::IDRefs))
            {
                XMLRefInfo* find = getScanner()->getIDRefList()->get(pszTmpVal);
                if (find)
                {
                    if (find->getDeclared() && (type == XMLAttDef::ID))
                        emitError(XMLValid::ReusedIDValue, pszTmpVal);
                }
                 else
                {
                    find = new (getScanner()->getMemoryManager()) XMLRefInfo
                    (
                        pszTmpVal
                        , false
                        , false
                        , getScanner()->getMemoryManager()
                    );
                    getScanner()->getIDRefList()->put((void*)find->getRefName(), find);
                }

                //
                //  Mark it declared or used, which might be redundant in some cases
                //  but not worth checking
                //
                if (type == XMLAttDef::ID)
                    find->setDeclared(true);
                else {
                    if (!preValidation) {
                        find->setUsed(true);
                    }
                }
            }
        }
         else if (!preValidation && ((type == XMLAttDef::Entity) || (type == XMLAttDef::Entities)))
        {
            //
            //  If its refering to a entity, then look up the name in the
            //  general entity pool. If not there, then its an error. If its
            //  not an external unparsed entity, then its an error.
            //
            //  In case of pre-validation, the above errors should be ignored.
            //
            const XMLEntityDecl* decl = fDTDGrammar->getEntityDecl(pszTmpVal);
            if (decl)
            {
                if (!decl->isUnparsed())
                    emitError(XMLValid::BadEntityRefAttr, pszTmpVal, fullName);
            }
             else
            {
                emitError
                (
                    XMLValid::UnknownEntityRefAttr
                    , fullName
                    , pszTmpVal
                );
            }
        }
         else if ((type == XMLAttDef::Notation) || (type == XMLAttDef::Enumeration))
        {
            //
            //  Make sure that this value maps to one of the enumeration or
            //  notation values in the enumList parameter. We don't have to
            //  look it up in the notation pool (if a notation) because we
            //  will look up the enumerated values themselves. If they are in
            //  the notation pool (after the DTD is parsed), then obviously
            //  this value will be legal since it matches one of them.
            //
            if (!XMLString::isInList(pszTmpVal, enumList))
                emitError(XMLValid::DoesNotMatchEnumList, pszTmpVal, fullName);
        }

        // If not doing multiple values, then we are done
        if (!multipleValues)
            break;

        //
        //  If we are at the end, then break out now, else move up to the
        //  next char and update the base pointer.
        //
        if (alreadyCapped)
            break;

        valPtr++;
        pszTmpVal = valPtr;
    }

}